

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O0

void __thiscall Date::setTime(Date *this,time_t time,Mode mode)

{
  tm *ptVar1;
  undefined1 local_58 [8];
  tm ltime;
  time_t tStack_18;
  Mode mode_local;
  time_t time_local;
  Date *this_local;
  
  ltime.tm_zone._4_4_ = mode;
  tStack_18 = time;
  time_local = (time_t)this;
  std::call_once<Date::setTime(long,Date::Mode)::__0>
            (&tzFlag,(anon_class_1_0_00000001 *)((long)&ltime.tm_zone + 3));
  if (ltime.tm_zone._4_4_ == UTC) {
    this->mTime = tStack_18;
  }
  else {
    ptVar1 = modetime(&stack0xffffffffffffffe8,(tm *)local_58,ltime.tm_zone._4_4_);
    if (ptVar1 != (tm *)0x0) {
      this->mTime = tStack_18 + ltime._32_8_;
    }
  }
  return;
}

Assistant:

void Date::setTime(time_t time, Mode mode)
{
    std::call_once(tzFlag, []() {
            tzset();
        });
    if (mode == UTC) {
        mTime = time;
    } else {
        struct tm ltime;
        if (modetime(time, &ltime, mode)) {
#ifdef _WIN32
            long tz = 0;

            // The following does NOT work because of linker errors:
            // _get_timezone(&tz);
            // user GetTimeZoneInformation() instead:
            TIME_ZONE_INFORMATION inf;
            GetTimeZoneInformation(&inf);
            tz = inf.Bias;

            mTime = time + tz;

#else
            mTime = time + ltime.tm_gmtoff;
#endif
        }
    }
}